

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void ghc::filesystem::copy_symlink(path *existing_symlink,path *new_symlink,error_code *ec)

{
  bool bVar1;
  error_category *peVar2;
  path to;
  path local_40;
  
  peVar2 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar2;
  read_symlink(&local_40,existing_symlink,ec);
  if (ec->_M_value == 0) {
    bVar1 = exists(&local_40,ec);
    if (bVar1) {
      detail::status_ex((path *)&stack0xffffffffffffffe0,(error_code *)&local_40,(file_status *)ec,
                        (uintmax_t *)0x0,(uintmax_t *)0x0,(time_t *)0x0,0);
    }
    detail::create_symlink(&local_40,new_symlink,false,ec);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._path._M_dataplus._M_p != &local_40._path.field_2) {
    operator_delete(local_40._path._M_dataplus._M_p,local_40._path.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

GHC_INLINE void copy_symlink(const path& existing_symlink, const path& new_symlink, std::error_code& ec) noexcept
{
    ec.clear();
    auto to = read_symlink(existing_symlink, ec);
    if (!ec) {
        if (exists(to, ec) && is_directory(to, ec)) {
            create_directory_symlink(to, new_symlink, ec);
        }
        else {
            create_symlink(to, new_symlink, ec);
        }
    }
}